

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O2

void ncnn::copy_make_border_image<signed_char>(Mat *src,Mat *dst,int top,int left,int type,char v)

{
  uint uVar1;
  int iVar2;
  int x_1;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  undefined1 *puVar9;
  size_t sVar10;
  ulong uVar11;
  void *pvVar12;
  int iVar13;
  long lVar14;
  undefined1 *puVar15;
  int iVar16;
  int iVar17;
  undefined1 *puVar18;
  undefined1 *puVar19;
  
  uVar1 = dst->w;
  lVar14 = (long)(int)uVar1;
  iVar2 = dst->h;
  puVar19 = (undefined1 *)src->data;
  pvVar12 = dst->data;
  lVar3 = (long)left;
  if (type == 0) {
    uVar11 = 0;
    if (0 < (int)uVar1) {
      uVar11 = (ulong)uVar1;
    }
    iVar16 = 0;
    iVar13 = 0;
    if (0 < top) {
      iVar16 = top;
      iVar13 = 0;
    }
    for (; iVar13 != iVar16; iVar13 = iVar13 + 1) {
      for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
        *(char *)((long)pvVar12 + uVar4) = v;
      }
      pvVar12 = (void *)((long)pvVar12 + lVar14);
    }
    uVar4 = 0;
    if (0 < left) {
      uVar4 = (ulong)(uint)left;
    }
    for (; iVar16 < src->h + top; iVar16 = iVar16 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        *(char *)((long)pvVar12 + uVar7) = v;
      }
      sVar10 = (size_t)src->w;
      uVar7 = uVar4;
      if ((long)sVar10 < 0xc) {
        for (; (long)uVar7 < (long)((int)sVar10 + left); uVar7 = uVar7 + 1) {
          *(undefined1 *)((long)pvVar12 + uVar7) = puVar19[uVar7 - lVar3];
          sVar10 = (size_t)(uint)src->w;
        }
      }
      else {
        memcpy((void *)(lVar3 + (long)pvVar12),puVar19,sVar10);
        uVar7 = (ulong)(uint)(src->w + (int)uVar4);
      }
      for (lVar5 = (long)(int)uVar7; lVar5 < lVar14; lVar5 = lVar5 + 1) {
        *(char *)((long)pvVar12 + lVar5) = v;
      }
      puVar19 = puVar19 + src->w;
      pvVar12 = (void *)((long)pvVar12 + lVar14);
    }
    for (; iVar16 < iVar2; iVar16 = iVar16 + 1) {
      for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
        *(char *)((long)pvVar12 + uVar4) = v;
      }
      pvVar12 = (void *)((long)pvVar12 + lVar14);
    }
  }
  else if (type == 2) {
    uVar11 = (ulong)(uint)src->w;
    puVar19 = puVar19 + src->w * top;
    iVar16 = 0;
    uVar4 = 0;
    if (0 < left) {
      uVar4 = (ulong)(uint)left;
    }
    iVar13 = 0;
    if (0 < top) {
      iVar13 = top;
    }
    puVar15 = (undefined1 *)(uVar4 + (long)pvVar12);
    lVar5 = -lVar3;
    iVar17 = left + -2;
    for (; iVar8 = (int)uVar4, iVar16 != iVar13; iVar16 = iVar16 + 1) {
      puVar18 = puVar19 + lVar3;
      for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
        *(undefined1 *)((long)pvVar12 + uVar11) = *puVar18;
        puVar18 = puVar18 + -1;
      }
      sVar10 = (size_t)src->w;
      uVar11 = uVar4;
      if ((long)sVar10 < 0xc) {
        for (; (long)uVar11 < (long)((int)sVar10 + left); uVar11 = uVar11 + 1) {
          *(undefined1 *)((long)pvVar12 + uVar11) = puVar19[uVar11 + lVar5];
          sVar10 = (size_t)(uint)src->w;
        }
      }
      else {
        memcpy((void *)(lVar3 + (long)pvVar12),puVar19,sVar10);
        uVar11 = (ulong)(uint)(src->w + iVar8);
      }
      iVar8 = iVar17 - (int)uVar11;
      for (lVar6 = (long)(int)uVar11; lVar6 < lVar14; lVar6 = lVar6 + 1) {
        *(undefined1 *)((long)pvVar12 + lVar6) = puVar19[iVar8 + src->w * 2];
        iVar8 = iVar8 + -1;
      }
      pvVar12 = (void *)((long)pvVar12 + lVar14);
      uVar11 = (ulong)src->w;
      puVar19 = puVar19 + -uVar11;
      puVar15 = puVar15 + lVar14;
    }
    for (; iVar13 < src->h + top; iVar13 = iVar13 + 1) {
      puVar18 = puVar19 + lVar3;
      for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
        *(undefined1 *)((long)pvVar12 + uVar11) = *puVar18;
        puVar18 = puVar18 + -1;
      }
      sVar10 = (size_t)src->w;
      uVar11 = uVar4;
      if ((long)sVar10 < 0xc) {
        for (; (long)uVar11 < (long)((int)sVar10 + left); uVar11 = uVar11 + 1) {
          *(undefined1 *)((long)pvVar12 + uVar11) = puVar19[uVar11 + lVar5];
          sVar10 = (size_t)(uint)src->w;
        }
      }
      else {
        memcpy((void *)(lVar3 + (long)pvVar12),puVar19,sVar10);
        uVar11 = (ulong)(uint)(src->w + iVar8);
      }
      lVar6 = (long)(int)uVar11;
      iVar16 = iVar17 - (int)uVar11;
      while( true ) {
        uVar1 = src->w;
        uVar11 = (ulong)uVar1;
        if (lVar14 <= lVar6) break;
        *(undefined1 *)((long)pvVar12 + lVar6) = puVar19[(int)(iVar16 + uVar1 * 2)];
        lVar6 = lVar6 + 1;
        iVar16 = iVar16 + -1;
      }
      puVar19 = puVar19 + (int)uVar1;
      pvVar12 = (void *)((long)pvVar12 + lVar14);
      puVar15 = puVar15 + lVar14;
    }
    puVar19 = puVar19 + -(long)((int)uVar11 * 2);
    for (; iVar13 < iVar2; iVar13 = iVar13 + 1) {
      puVar18 = puVar19 + lVar3;
      for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
        *(undefined1 *)((long)pvVar12 + uVar11) = *puVar18;
        puVar18 = puVar18 + -1;
      }
      sVar10 = (size_t)src->w;
      uVar11 = uVar4;
      puVar18 = puVar15;
      if ((long)sVar10 < 0xc) {
        for (; (long)uVar11 < (long)((int)sVar10 + left); uVar11 = uVar11 + 1) {
          *puVar18 = puVar19[uVar11 + lVar5];
          sVar10 = (size_t)(uint)src->w;
          puVar18 = puVar18 + 1;
        }
      }
      else {
        memcpy((void *)(lVar3 + (long)pvVar12),puVar19,sVar10);
        uVar11 = (ulong)(uint)(src->w + iVar8);
      }
      iVar16 = iVar17 - (int)uVar11;
      for (lVar6 = (long)(int)uVar11; lVar6 < lVar14; lVar6 = lVar6 + 1) {
        *(undefined1 *)((long)pvVar12 + lVar6) = puVar19[iVar16 + src->w * 2];
        iVar16 = iVar16 + -1;
      }
      pvVar12 = (void *)((long)pvVar12 + lVar14);
      puVar19 = puVar19 + -(long)src->w;
      puVar15 = puVar15 + lVar14;
    }
  }
  else if (type == 1) {
    iVar16 = 0;
    uVar11 = 0;
    if (0 < left) {
      uVar11 = (ulong)(uint)left;
    }
    iVar13 = 0;
    if (0 < top) {
      iVar13 = top;
    }
    puVar15 = (undefined1 *)(uVar11 + (long)pvVar12);
    for (; iVar17 = (int)uVar11, iVar16 != iVar13; iVar16 = iVar16 + 1) {
      for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
        *(undefined1 *)((long)pvVar12 + uVar4) = *puVar19;
      }
      sVar10 = (size_t)src->w;
      uVar4 = uVar11;
      if ((long)sVar10 < 0xc) {
        for (; (long)uVar4 < (long)((int)sVar10 + left); uVar4 = uVar4 + 1) {
          *(undefined1 *)((long)pvVar12 + uVar4) = puVar19[uVar4 - lVar3];
          sVar10 = (size_t)(uint)src->w;
        }
      }
      else {
        memcpy((void *)(lVar3 + (long)pvVar12),puVar19,sVar10);
        uVar4 = (ulong)(uint)(src->w + iVar17);
      }
      for (lVar5 = (long)(int)uVar4; lVar5 < lVar14; lVar5 = lVar5 + 1) {
        *(undefined1 *)((long)pvVar12 + lVar5) = puVar19[(long)src->w + -1];
      }
      pvVar12 = (void *)((long)pvVar12 + lVar14);
      puVar15 = puVar15 + lVar14;
    }
    for (; iVar13 < src->h + top; iVar13 = iVar13 + 1) {
      for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
        *(undefined1 *)((long)pvVar12 + uVar4) = *puVar19;
      }
      sVar10 = (size_t)src->w;
      uVar4 = uVar11;
      if ((long)sVar10 < 0xc) {
        for (; (long)uVar4 < (long)((int)sVar10 + left); uVar4 = uVar4 + 1) {
          *(undefined1 *)((long)pvVar12 + uVar4) = puVar19[uVar4 - lVar3];
          sVar10 = (size_t)(uint)src->w;
        }
      }
      else {
        memcpy((void *)(lVar3 + (long)pvVar12),puVar19,sVar10);
        uVar4 = (ulong)(uint)(src->w + iVar17);
      }
      for (lVar5 = (long)(int)uVar4; lVar5 < lVar14; lVar5 = lVar5 + 1) {
        *(undefined1 *)((long)pvVar12 + lVar5) = puVar19[(long)src->w + -1];
      }
      puVar19 = puVar19 + src->w;
      pvVar12 = (void *)((long)pvVar12 + lVar14);
      puVar15 = puVar15 + lVar14;
    }
    iVar16 = src->w;
    puVar18 = puVar19 + -(long)iVar16;
    for (; iVar13 < iVar2; iVar13 = iVar13 + 1) {
      for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
        *(undefined1 *)((long)pvVar12 + uVar4) = *puVar18;
      }
      sVar10 = (size_t)src->w;
      uVar4 = uVar11;
      puVar9 = puVar15;
      if ((long)sVar10 < 0xc) {
        for (; (long)uVar4 < (long)((int)sVar10 + left); uVar4 = uVar4 + 1) {
          *puVar9 = puVar19[uVar4 - (iVar16 + lVar3)];
          sVar10 = (size_t)(uint)src->w;
          puVar9 = puVar9 + 1;
        }
      }
      else {
        memcpy((void *)(lVar3 + (long)pvVar12),puVar18,sVar10);
        uVar4 = (ulong)(uint)(src->w + iVar17);
      }
      for (lVar5 = (long)(int)uVar4; lVar5 < lVar14; lVar5 = lVar5 + 1) {
        *(undefined1 *)((long)pvVar12 + lVar5) = puVar18[(long)src->w + -1];
      }
      pvVar12 = (void *)((long)pvVar12 + lVar14);
      puVar15 = puVar15 + lVar14;
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }
    else if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }
    else if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }

}